

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O2

int Pdr_ManCheckCubeCs(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  long lVar1;
  long lVar2;
  abctime aVar3;
  int iVar4;
  sat_solver *s;
  Vec_Int_t *pVVar5;
  long lVar6;
  
  s = Pdr_ManFetchSolver(p,k);
  pVVar5 = Pdr_ManCubeToLits(p,k,pCube,0,0);
  lVar1 = p->timeToStop;
  lVar2 = p->timeToStopOne;
  lVar6 = lVar2;
  if (((lVar1 != 0) && (lVar6 = lVar1, lVar2 != 0)) && (lVar6 = lVar2, lVar1 < lVar2)) {
    lVar6 = lVar1;
  }
  aVar3 = s->nRuntimeLimit;
  s->nRuntimeLimit = lVar6;
  iVar4 = sat_solver_solve(s,pVVar5->pArray,pVVar5->pArray + pVVar5->nSize,0,0,0,0);
  s->nRuntimeLimit = aVar3;
  return -(uint)(iVar4 == 0) | (uint)(iVar4 == -1);
}

Assistant:

int Pdr_ManCheckCubeCs( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{ 
    sat_solver * pSat;
    Vec_Int_t * vLits;
    abctime Limit;
    int RetValue;
    pSat = Pdr_ManFetchSolver( p, k );
    vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 0 );
    Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
    sat_solver_set_runtime_limit( pSat, Limit );
    if ( RetValue == l_Undef )
        return -1;
    return (RetValue == l_False);
}